

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_list.cpp
# Opt level: O2

bool __thiscall
duckdb::GlobMultiFileList::ExpandPathInternal
          (GlobMultiFileList *this,idx_t *current_path,vector<duckdb::OpenFileInfo,_true> *result)

{
  ulong uVar1;
  ulong uVar2;
  FileSystem *this_00;
  const_reference pattern;
  vector<duckdb::OpenFileInfo,_true> glob_files;
  
  uVar1 = *current_path;
  uVar2 = ((long)(this->super_MultiFileList).paths.
                 super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                 super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->super_MultiFileList).paths.
                super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x30;
  if (uVar1 < uVar2) {
    this_00 = FileSystem::GetFileSystem(this->context);
    pattern = vector<duckdb::OpenFileInfo,_true>::get<true>
                        (&(this->super_MultiFileList).paths,*current_path);
    FileSystem::GlobFiles
              (&glob_files,this_00,(string *)pattern,this->context,
               (this->super_MultiFileList).glob_options);
    ::std::
    __sort<__gnu_cxx::__normal_iterator<duckdb::OpenFileInfo*,std::vector<duckdb::OpenFileInfo,std::allocator<duckdb::OpenFileInfo>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (glob_files.super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
               super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
               _M_impl.super__Vector_impl_data._M_start,
               glob_files.super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
               super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    ::std::vector<duckdb::OpenFileInfo,std::allocator<duckdb::OpenFileInfo>>::
    insert<__gnu_cxx::__normal_iterator<duckdb::OpenFileInfo*,std::vector<duckdb::OpenFileInfo,std::allocator<duckdb::OpenFileInfo>>>,void>
              ((vector<duckdb::OpenFileInfo,std::allocator<duckdb::OpenFileInfo>> *)result,
               (result->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
               super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<duckdb::OpenFileInfo_*,_std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>_>
                )glob_files.
                 super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                 super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<duckdb::OpenFileInfo_*,_std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>_>
                )glob_files.
                 super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                 super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    *current_path = *current_path + 1;
    ::std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
              ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)&glob_files);
  }
  return uVar1 < uVar2;
}

Assistant:

bool GlobMultiFileList::ExpandPathInternal(idx_t &current_path, vector<OpenFileInfo> &result) const {
	if (current_path >= paths.size()) {
		return false;
	}

	auto &fs = FileSystem::GetFileSystem(context);
	auto glob_files = fs.GlobFiles(paths[current_path].path, context, glob_options);
	std::sort(glob_files.begin(), glob_files.end());
	result.insert(result.end(), glob_files.begin(), glob_files.end());

	current_path++;
	return true;
}